

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

uint16_t __thiscall CConnman::GetDefaultPort(CConnman *this,string *addr)

{
  bool bVar1;
  string *in_RDI;
  long in_FS_OFFSET;
  CNetAddr a;
  CChainParams *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  Network in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffff9c;
  undefined2 in_stack_ffffffffffffff9e;
  uint16_t local_60;
  CNetAddr *this_00;
  CNetAddr local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_28;
  CNetAddr::CNetAddr((CNetAddr *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  bVar1 = CNetAddr::SetSpecial(this_00,in_RDI);
  if (bVar1) {
    CNetAddr::GetNetwork((CNetAddr *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    local_60 = GetDefaultPort((CConnman *)
                              CONCAT26(in_stack_ffffffffffffff9e,
                                       CONCAT24(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                                      ),in_stack_ffffffffffffff94);
  }
  else {
    local_60 = CChainParams::GetDefaultPort(in_stack_ffffffffffffff88);
  }
  CNetAddr::~CNetAddr((CNetAddr *)in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_60;
  }
  __stack_chk_fail();
}

Assistant:

uint16_t CConnman::GetDefaultPort(const std::string& addr) const
{
    CNetAddr a;
    return a.SetSpecial(addr) ? GetDefaultPort(a.GetNetwork()) : m_params.GetDefaultPort();
}